

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void COVER_best_destroy(COVER_best_t *best)

{
  if (best != (COVER_best_t *)0x0) {
    COVER_best_wait(best);
    free(best->dict);
    pthread_mutex_destroy((pthread_mutex_t *)best);
    pthread_cond_destroy((pthread_cond_t *)&best->cond);
    return;
  }
  return;
}

Assistant:

void COVER_best_destroy(COVER_best_t *best) {
  if (!best) {
    return;
  }
  COVER_best_wait(best);
  if (best->dict) {
    free(best->dict);
  }
  ZSTD_pthread_mutex_destroy(&best->mutex);
  ZSTD_pthread_cond_destroy(&best->cond);
}